

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

bool google::protobuf::compiler::php::anon_unknown_2::GenerateField
               (FieldDescriptor *field,Printer *printer,Options *options,string *error)

{
  Options *pOVar1;
  bool bVar2;
  Type TVar3;
  ulong uVar4;
  DescriptorStringView psVar5;
  OneofDescriptor *pOVar6;
  undefined1 auVar7 [16];
  string_view local_1e8 [2];
  byte local_1c2;
  allocator<char> local_1c1;
  undefined1 local_1c0 [8];
  string initial_value;
  AlphaNum local_190;
  AlphaNum local_160;
  AlphaNum local_130;
  undefined1 local_100 [80];
  AlphaNum local_b0;
  AlphaNum local_80;
  undefined1 local_50 [40];
  string *error_local;
  Options *options_local;
  Printer *printer_local;
  FieldDescriptor *field_local;
  
  local_50._32_8_ = error;
  error_local = (string *)options;
  options_local = (Options *)printer;
  printer_local = (Printer *)field;
  uVar4 = google::protobuf::FieldDescriptor::is_required();
  if ((uVar4 & 1) == 0) {
    TVar3 = FieldDescriptor::type((FieldDescriptor *)printer_local);
    if (TVar3 == TYPE_GROUP) {
      absl::lts_20240722::AlphaNum::AlphaNum(&local_130,"Can\'t generate PHP code for group field ")
      ;
      psVar5 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)printer_local);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_160,psVar5);
      absl::lts_20240722::AlphaNum::AlphaNum
                (&local_190,".  Use regular message encoding instead.\n");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_100,&local_130,&local_160);
      std::__cxx11::string::operator=((string *)local_50._32_8_,(string *)local_100);
      std::__cxx11::string::~string((string *)local_100);
      field_local._7_1_ = false;
    }
    else {
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)printer_local);
      if (bVar2) {
        GenerateFieldDocComment
                  ((Printer *)options_local,(FieldDescriptor *)printer_local,(Options *)error_local,
                   3);
        pOVar1 = options_local;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&initial_value.field_2 + 8),"private $^name^;\n");
        psVar5 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)pOVar1,stack0xfffffffffffffe60,(char (*) [5])0x6b980f,psVar5);
      }
      else {
        pOVar6 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)printer_local);
        if (pOVar6 != (OneofDescriptor *)0x0) {
          return true;
        }
        auVar7 = google::protobuf::FieldDescriptor::has_presence();
        local_1c2 = 0;
        if ((auVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          (anonymous_namespace)::DefaultForField_abi_cxx11_
                    ((string *)local_1c0,(_anonymous_namespace_ *)printer_local,auVar7._8_8_);
        }
        else {
          std::allocator<char>::allocator();
          local_1c2 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,"null",&local_1c1);
        }
        if ((local_1c2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_1c1);
        }
        GenerateFieldDocComment
                  ((Printer *)options_local,(FieldDescriptor *)printer_local,(Options *)error_local,
                   3);
        pOVar1 = options_local;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (local_1e8,"protected $^name^ = ^initial_value^;\n");
        psVar5 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
        io::Printer::Print<char[5],std::__cxx11::string,char[14],std::__cxx11::string>
                  ((Printer *)pOVar1,local_1e8[0],(char (*) [5])0x6b980f,psVar5,
                   (char (*) [14])"initial_value",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
        std::__cxx11::string::~string((string *)local_1c0);
      }
      field_local._7_1_ = true;
    }
  }
  else {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_80,"Can\'t generate PHP code for required field ")
    ;
    psVar5 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)printer_local);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_b0,psVar5);
    absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_100 + 0x20),".\n");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_50,&local_80,&local_b0);
    std::__cxx11::string::operator=((string *)local_50._32_8_,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    field_local._7_1_ = false;
  }
  return field_local._7_1_;
}

Assistant:

bool GenerateField(const FieldDescriptor* field, io::Printer* printer,
                   const Options& options, std::string* error) {
  if (field->is_required()) {
    *error = absl::StrCat("Can't generate PHP code for required field ",
                          field->full_name(), ".\n");
    return false;
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    *error = absl::StrCat("Can't generate PHP code for group field ",
                          field->full_name(),
                          ".  Use regular message encoding instead.\n");
    return false;
  }

  if (field->is_repeated()) {
    GenerateFieldDocComment(printer, field, options, kFieldProperty);
    printer->Print("private $^name^;\n", "name", field->name());
  } else if (field->real_containing_oneof()) {
    // Oneof fields are handled by GenerateOneofField.
    return true;
  } else {
    std::string initial_value =
        field->has_presence() ? "null" : DefaultForField(field);
    GenerateFieldDocComment(printer, field, options, kFieldProperty);
    printer->Print("protected $^name^ = ^initial_value^;\n", "name",
                   field->name(), "initial_value", initial_value);
  }
  return true;
}